

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Lookup
          (PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this,
          float_na_equal *value)

{
  primitive_dictionary_entry_t *ppVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  
  uVar4 = Hash<duckdb::float_na_equal>(*(undefined4 *)value);
  fVar2 = *(float *)value;
  while( true ) {
    uVar4 = uVar4 & this->capacity_mask;
    ppVar1 = this->dictionary + uVar4;
    if (ppVar1->index == 0xffffffff) {
      return ppVar1;
    }
    fVar3 = *(float *)ppVar1;
    if (NAN(fVar3) && NAN(fVar2)) break;
    uVar4 = uVar4 + 1;
    if ((fVar3 == fVar2) && (!NAN(fVar3) && !NAN(fVar2))) {
      return ppVar1;
    }
  }
  return ppVar1;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}